

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               uint minimum_chain_length,ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  ON_SubDEdge *e;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  uVar1 = unsorted_edges->m_count;
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray(&local_48,(ulong)uVar1);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_50 = ON_SubD::EdgeFromComponentIndex(subd,unsorted_edges->m_a[uVar2]);
    if (local_50 != (ON_SubDEdge *)0x0) {
      ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
    }
  }
  uVar1 = SortEdgesIntoEdgeChains(&local_48,minimum_chain_length,sorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = subd.EdgeFromComponentIndex(unsorted_edges[i]);
    if (nullptr != e)
      a.Append(e);
  }
  return SortEdgesIntoEdgeChains(a, minimum_chain_length, sorted_edges);
}